

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.cc
# Opt level: O0

void __thiscall serial::Serial::SerialImpl::reconfigurePort(SerialImpl *this)

{
  unsigned_long uVar1;
  code *pcVar2;
  int iVar3;
  IOException *pIVar4;
  int *piVar5;
  invalid_argument *piVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  allocator local_141;
  uint32_t bit_time_ns;
  undefined1 local_11a;
  allocator local_119;
  string local_118;
  undefined1 local_f8 [8];
  serial_struct ser;
  speed_t baud;
  bool custom_baud;
  undefined1 local_84 [8];
  termios options;
  allocator local_31;
  string local_30;
  SerialImpl *local_10;
  SerialImpl *this_local;
  
  local_10 = this;
  if (this->fd_ == -1) {
    options.c_ispeed._3_1_ = 1;
    pIVar4 = (IOException *)__cxa_allocate_exception(0x58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/seritake[P]TwoDimetionalInvertedPendlum/src/impl/unix.cc"
               ,&local_31);
    IOException::IOException
              (pIVar4,&local_30,0xa4,"Invalid file descriptor, is the serial port open?");
    options.c_ispeed._3_1_ = 0;
    __cxa_throw(pIVar4,&IOException::typeinfo,IOException::~IOException);
  }
  iVar3 = tcgetattr(this->fd_,(termios *)local_84);
  if (iVar3 == -1) {
    ser.iomap_base._6_1_ = 1;
    pIVar4 = (IOException *)__cxa_allocate_exception(0x58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&baud,
               "/workspace/llm4binary/github/license_all_cmakelists_25/seritake[P]TwoDimetionalInvertedPendlum/src/impl/unix.cc"
               ,(allocator *)((long)&ser.iomap_base + 7));
    IOException::IOException(pIVar4,(string *)&baud,0xaa,"::tcgetattr");
    ser.iomap_base._6_1_ = 0;
    __cxa_throw(pIVar4,&IOException::typeinfo,IOException::~IOException);
  }
  options.c_iflag = options.c_iflag | 0x880;
  options.c_oflag = options.c_oflag & 0xffff7f84;
  local_84[4] = local_84[4] & 0xfe;
  local_84._0_4_ = local_84._0_4_ & 0xfffffc36;
  ser.iomap_base._5_1_ = 0;
  pcVar2 = (code *)this->baudrate_;
  if (pcVar2 == (code *)0x0) {
    ser.iomap_base._0_4_ = 0;
  }
  else if (pcVar2 == (code *)0x32) {
    ser.iomap_base._0_4_ = 1;
  }
  else if (pcVar2 == (code *)0x4b) {
    ser.iomap_base._0_4_ = 2;
  }
  else if (pcVar2 == (code *)0x6e) {
    ser.iomap_base._0_4_ = 3;
  }
  else if (pcVar2 == (code *)0x86) {
    ser.iomap_base._0_4_ = 4;
  }
  else if (pcVar2 == (code *)0x96) {
    ser.iomap_base._0_4_ = 5;
  }
  else if (pcVar2 == (code *)0xc8) {
    ser.iomap_base._0_4_ = 6;
  }
  else if (pcVar2 == (code *)0x12c) {
    ser.iomap_base._0_4_ = 7;
  }
  else if (pcVar2 == (code *)0x258) {
    ser.iomap_base._0_4_ = 8;
  }
  else if (pcVar2 == (code *)0x4b0) {
    ser.iomap_base._0_4_ = 9;
  }
  else if (pcVar2 == (code *)0x708) {
    ser.iomap_base._0_4_ = 10;
  }
  else if (pcVar2 == (code *)0x960) {
    ser.iomap_base._0_4_ = 0xb;
  }
  else if (pcVar2 == (code *)0x12c0) {
    ser.iomap_base._0_4_ = 0xc;
  }
  else if (pcVar2 == (code *)0x2580) {
    ser.iomap_base._0_4_ = 0xd;
  }
  else if (pcVar2 == (code *)0x4b00) {
    ser.iomap_base._0_4_ = 0xe;
  }
  else if (pcVar2 == (code *)0x9600) {
    ser.iomap_base._0_4_ = 0xf;
  }
  else if (pcVar2 == (code *)0xe100) {
    ser.iomap_base._0_4_ = 0x1001;
  }
  else if (pcVar2 == (code *)0x1c200) {
    ser.iomap_base._0_4_ = 0x1002;
  }
  else if (pcVar2 == (code *)0x38400) {
    ser.iomap_base._0_4_ = 0x1003;
  }
  else if (pcVar2 == (code *)0x70800) {
    ser.iomap_base._0_4_ = 0x1004;
  }
  else if (pcVar2 == (code *)0x7a120) {
    ser.iomap_base._0_4_ = 0x1005;
  }
  else if (pcVar2 == (code *)0x8ca00) {
    ser.iomap_base._0_4_ = 0x1006;
  }
  else if (pcVar2 == (code *)0xe1000) {
    ser.iomap_base._0_4_ = 0x1007;
  }
  else if (pcVar2 == (code *)0xf4240) {
    ser.iomap_base._0_4_ = 0x1008;
  }
  else if (pcVar2 == Eigen::internal::
                     evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_3,_1>_>_>
                     ::evaluator) {
    ser.iomap_base._0_4_ = 0x1009;
  }
  else if (pcVar2 == (code *)&DWORD_0016e360) {
    ser.iomap_base._0_4_ = 0x100a;
  }
  else if (pcVar2 == (code *)0x1e8480) {
    ser.iomap_base._0_4_ = 0x100b;
  }
  else if (pcVar2 == (code *)0x2625a0) {
    ser.iomap_base._0_4_ = 0x100c;
  }
  else if (pcVar2 == (code *)0x2dc6c0) {
    ser.iomap_base._0_4_ = 0x100d;
  }
  else if (pcVar2 == (code *)0x3567e0) {
    ser.iomap_base._0_4_ = 0x100e;
  }
  else if (pcVar2 == (code *)0x3d0900) {
    ser.iomap_base._0_4_ = 0x100f;
  }
  else {
    ser.iomap_base._5_1_ = 1;
    iVar3 = ioctl(this->fd_,0x541e,local_f8);
    if (iVar3 == -1) {
      local_11a = 1;
      pIVar4 = (IOException *)__cxa_allocate_exception(0x58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_118,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/seritake[P]TwoDimetionalInvertedPendlum/src/impl/unix.cc"
                 ,&local_119);
      piVar5 = __errno_location();
      IOException::IOException(pIVar4,&local_118,0x142,*piVar5);
      local_11a = 0;
      __cxa_throw(pIVar4,&IOException::typeinfo,IOException::~IOException);
    }
    ser.flags = ser.xmit_fifo_size / (int)this->baudrate_;
    ser.port = ser.port & 0xffffefcf | 0x30;
    iVar3 = ioctl(this->fd_,0x541f,local_f8);
    if (iVar3 == -1) {
      pIVar4 = (IOException *)__cxa_allocate_exception(0x58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&bit_time_ns,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/seritake[P]TwoDimetionalInvertedPendlum/src/impl/unix.cc"
                 ,&local_141);
      piVar5 = __errno_location();
      IOException::IOException(pIVar4,(string *)&bit_time_ns,0x14c,*piVar5);
      __cxa_throw(pIVar4,&IOException::typeinfo,IOException::~IOException);
    }
  }
  if ((ser.iomap_base._5_1_ & 1) == 0) {
    cfsetispeed((termios *)local_84,(speed_t)ser.iomap_base);
    cfsetospeed((termios *)local_84,(speed_t)ser.iomap_base);
  }
  options.c_iflag = options.c_iflag & 0xffffffcf;
  if (this->bytesize_ == eightbits) {
    options.c_iflag = options.c_iflag | 0x30;
  }
  else if (this->bytesize_ == sevenbits) {
    options.c_iflag = options.c_iflag | 0x20;
  }
  else if (this->bytesize_ == sixbits) {
    options.c_iflag = options.c_iflag | 0x10;
  }
  else if (this->bytesize_ != fivebits) {
    piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar6,"invalid char len");
    __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if (this->stopbits_ == stopbits_one) {
    options.c_iflag = options.c_iflag & 0xffffffbf;
  }
  else {
    if ((this->stopbits_ != stopbits_one_point_five) && (this->stopbits_ != stopbits_two)) {
      piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar6,"invalid stop bit");
      __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    options.c_iflag = options.c_iflag | 0x40;
  }
  if (this->parity_ == parity_none) {
    options.c_iflag = options.c_iflag & 0xfffffcff;
  }
  else if (this->parity_ == parity_even) {
    options.c_iflag = options.c_iflag & 0xfffffdff | 0x100;
  }
  else if (this->parity_ == parity_odd) {
    options.c_iflag = options.c_iflag | 0x300;
  }
  else if (this->parity_ == parity_mark) {
    options.c_iflag = options.c_iflag | 0x40000300;
  }
  else {
    if (this->parity_ != parity_space) {
      local_84._0_4_ = local_84._0_4_ & 0xffffffcf;
      piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar6,"invalid parity");
      __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    options.c_iflag = options.c_iflag & 0xfffffdff | 0x40000100;
  }
  if (this->flowcontrol_ == flowcontrol_none) {
    this->xonxoff_ = false;
    this->rtscts_ = false;
  }
  if (this->flowcontrol_ == flowcontrol_software) {
    this->xonxoff_ = true;
    this->rtscts_ = false;
  }
  if (this->flowcontrol_ == flowcontrol_hardware) {
    this->xonxoff_ = false;
    this->rtscts_ = true;
  }
  if ((this->xonxoff_ & 1U) == 0) {
    local_84._0_4_ = local_84._0_4_ & 0xffffe3cf;
  }
  else {
    local_84._0_4_ = local_84._0_4_ & 0xffffffcf | 0x1400;
  }
  if ((this->rtscts_ & 1U) == 0) {
    options.c_iflag = options.c_iflag & 0x7fffffff;
  }
  else {
    options.c_iflag = options.c_iflag | 0x80000000;
  }
  options.c_lflag._3_1_ = 0;
  options.c_lflag._2_1_ = 0;
  tcsetattr(this->fd_,0,(termios *)local_84);
  uVar1 = this->baudrate_;
  auVar8._8_4_ = (int)(uVar1 >> 0x20);
  auVar8._0_8_ = uVar1;
  auVar8._12_4_ = 0x45300000;
  uVar7 = (ulong)(1000000000.0 /
                 ((auVar8._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)));
  this->byte_time_ns_ = (int)uVar7 * (this->bytesize_ + 1 + this->parity_ + this->stopbits_);
  if (this->stopbits_ == stopbits_one_point_five) {
    this->byte_time_ns_ =
         (uint32_t)(long)((double)(uVar7 & 0xffffffff) * -1.5 + (double)this->byte_time_ns_);
  }
  return;
}

Assistant:

void
Serial::SerialImpl::reconfigurePort ()
{
  if (fd_ == -1) {
    // Can only operate on a valid file descriptor
    THROW (IOException, "Invalid file descriptor, is the serial port open?");
  }

  struct termios options; // The options for the file descriptor

  if (tcgetattr(fd_, &options) == -1) {
    THROW (IOException, "::tcgetattr");
  }

  // set up raw mode / no echo / binary
  options.c_cflag |= (tcflag_t)  (CLOCAL | CREAD);
  options.c_lflag &= (tcflag_t) ~(ICANON | ECHO | ECHOE | ECHOK | ECHONL |
                                       ISIG | IEXTEN); //|ECHOPRT

  options.c_oflag &= (tcflag_t) ~(OPOST);
  options.c_iflag &= (tcflag_t) ~(INLCR | IGNCR | ICRNL | IGNBRK);
#ifdef IUCLC
  options.c_iflag &= (tcflag_t) ~IUCLC;
#endif
#ifdef PARMRK
  options.c_iflag &= (tcflag_t) ~PARMRK;
#endif

  // setup baud rate
  bool custom_baud = false;
  speed_t baud;
  switch (baudrate_) {
#ifdef B0
  case 0: baud = B0; break;
#endif
#ifdef B50
  case 50: baud = B50; break;
#endif
#ifdef B75
  case 75: baud = B75; break;
#endif
#ifdef B110
  case 110: baud = B110; break;
#endif
#ifdef B134
  case 134: baud = B134; break;
#endif
#ifdef B150
  case 150: baud = B150; break;
#endif
#ifdef B200
  case 200: baud = B200; break;
#endif
#ifdef B300
  case 300: baud = B300; break;
#endif
#ifdef B600
  case 600: baud = B600; break;
#endif
#ifdef B1200
  case 1200: baud = B1200; break;
#endif
#ifdef B1800
  case 1800: baud = B1800; break;
#endif
#ifdef B2400
  case 2400: baud = B2400; break;
#endif
#ifdef B4800
  case 4800: baud = B4800; break;
#endif
#ifdef B7200
  case 7200: baud = B7200; break;
#endif
#ifdef B9600
  case 9600: baud = B9600; break;
#endif
#ifdef B14400
  case 14400: baud = B14400; break;
#endif
#ifdef B19200
  case 19200: baud = B19200; break;
#endif
#ifdef B28800
  case 28800: baud = B28800; break;
#endif
#ifdef B57600
  case 57600: baud = B57600; break;
#endif
#ifdef B76800
  case 76800: baud = B76800; break;
#endif
#ifdef B38400
  case 38400: baud = B38400; break;
#endif
#ifdef B115200
  case 115200: baud = B115200; break;
#endif
#ifdef B128000
  case 128000: baud = B128000; break;
#endif
#ifdef B153600
  case 153600: baud = B153600; break;
#endif
#ifdef B230400
  case 230400: baud = B230400; break;
#endif
#ifdef B256000
  case 256000: baud = B256000; break;
#endif
#ifdef B460800
  case 460800: baud = B460800; break;
#endif
#ifdef B500000
  case 500000: baud = B500000; break;
#endif
#ifdef B576000
  case 576000: baud = B576000; break;
#endif
#ifdef B921600
  case 921600: baud = B921600; break;
#endif
#ifdef B1000000
  case 1000000: baud = B1000000; break;
#endif
#ifdef B1152000
  case 1152000: baud = B1152000; break;
#endif
#ifdef B1500000
  case 1500000: baud = B1500000; break;
#endif
#ifdef B2000000
  case 2000000: baud = B2000000; break;
#endif
#ifdef B2500000
  case 2500000: baud = B2500000; break;
#endif
#ifdef B3000000
  case 3000000: baud = B3000000; break;
#endif
#ifdef B3500000
  case 3500000: baud = B3500000; break;
#endif
#ifdef B4000000
  case 4000000: baud = B4000000; break;
#endif
  default:
    custom_baud = true;
    // OS X support
#if defined(MAC_OS_X_VERSION_10_4) && (MAC_OS_X_VERSION_MIN_REQUIRED >= MAC_OS_X_VERSION_10_4)
    // Starting with Tiger, the IOSSIOSPEED ioctl can be used to set arbitrary baud rates
    // other than those specified by POSIX. The driver for the underlying serial hardware
    // ultimately determines which baud rates can be used. This ioctl sets both the input
    // and output speed.
    speed_t new_baud = static_cast<speed_t> (baudrate_);
    if (-1 == ioctl (fd_, IOSSIOSPEED, &new_baud, 1)) {
      THROW (IOException, errno);
    }
    // Linux Support
#elif defined(__linux__) && defined (TIOCSSERIAL)
    struct serial_struct ser;

    if (-1 == ioctl (fd_, TIOCGSERIAL, &ser)) {
      THROW (IOException, errno);
    }

    // set custom divisor
    ser.custom_divisor = ser.baud_base / static_cast<int> (baudrate_);
    // update flags
    ser.flags &= ~ASYNC_SPD_MASK;
    ser.flags |= ASYNC_SPD_CUST;

    if (-1 == ioctl (fd_, TIOCSSERIAL, &ser)) {
      THROW (IOException, errno);
    }
#else
    throw invalid_argument ("OS does not currently support custom bauds");
#endif
  }
  if (custom_baud == false) {
#ifdef _BSD_SOURCE
    ::cfsetspeed(&options, baud);
#else
    ::cfsetispeed(&options, baud);
    ::cfsetospeed(&options, baud);
#endif
  }

  // setup char len
  options.c_cflag &= (tcflag_t) ~CSIZE;
  if (bytesize_ == eightbits)
    options.c_cflag |= CS8;
  else if (bytesize_ == sevenbits)
    options.c_cflag |= CS7;
  else if (bytesize_ == sixbits)
    options.c_cflag |= CS6;
  else if (bytesize_ == fivebits)
    options.c_cflag |= CS5;
  else
    throw invalid_argument ("invalid char len");
  // setup stopbits
  if (stopbits_ == stopbits_one)
    options.c_cflag &= (tcflag_t) ~(CSTOPB);
  else if (stopbits_ == stopbits_one_point_five)
    // ONE POINT FIVE same as TWO.. there is no POSIX support for 1.5
    options.c_cflag |=  (CSTOPB);
  else if (stopbits_ == stopbits_two)
    options.c_cflag |=  (CSTOPB);
  else
    throw invalid_argument ("invalid stop bit");
  // setup parity
  options.c_iflag &= (tcflag_t) ~(INPCK | ISTRIP);
  if (parity_ == parity_none) {
    options.c_cflag &= (tcflag_t) ~(PARENB | PARODD);
  } else if (parity_ == parity_even) {
    options.c_cflag &= (tcflag_t) ~(PARODD);
    options.c_cflag |=  (PARENB);
  } else if (parity_ == parity_odd) {
    options.c_cflag |=  (PARENB | PARODD);
  }
#ifdef CMSPAR
  else if (parity_ == parity_mark) {
    options.c_cflag |=  (PARENB | CMSPAR | PARODD);
  }
  else if (parity_ == parity_space) {
    options.c_cflag |=  (PARENB | CMSPAR);
    options.c_cflag &= (tcflag_t) ~(PARODD);
  }
#else
  // CMSPAR is not defined on OSX. So do not support mark or space parity.
  else if (parity_ == parity_mark || parity_ == parity_space) {
    throw invalid_argument ("OS does not support mark or space parity");
  }
#endif  // ifdef CMSPAR
  else {
    throw invalid_argument ("invalid parity");
  }